

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socket_test.cpp
# Opt level: O1

void __thiscall ot::commissioner::MockSocket::MockSocket(MockSocket *this,MockSocket *aOther)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var1;
  undefined8 uVar2;
  MessageSubType MVar3;
  
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__Socket_00279d98;
  memcpy(&(this->super_Socket).mEventBase,&(aOther->super_Socket).mEventBase,0x88);
  *(undefined8 *)&(this->super_Socket).mEventHandler.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 8) = 0
  ;
  (this->super_Socket).mEventHandler.super__Function_base._M_manager = (_Manager_type)0x0;
  (this->super_Socket).mEventHandler._M_invoker = (aOther->super_Socket).mEventHandler._M_invoker;
  if ((aOther->super_Socket).mEventHandler.super__Function_base._M_manager != (_Manager_type)0x0) {
    uVar2 = *(undefined8 *)
             ((long)&(aOther->super_Socket).mEventHandler.super__Function_base._M_functor + 8);
    *(undefined8 *)&(this->super_Socket).mEventHandler.super__Function_base._M_functor =
         *(undefined8 *)&(aOther->super_Socket).mEventHandler.super__Function_base._M_functor;
    *(undefined8 *)((long)&(this->super_Socket).mEventHandler.super__Function_base._M_functor + 8) =
         uVar2;
    (this->super_Socket).mEventHandler.super__Function_base._M_manager =
         (aOther->super_Socket).mEventHandler.super__Function_base._M_manager;
    (aOther->super_Socket).mEventHandler.super__Function_base._M_manager = (_Manager_type)0x0;
    (aOther->super_Socket).mEventHandler._M_invoker = (_Invoker_type)0x0;
  }
  MVar3 = (aOther->super_Socket).mSubType;
  (this->super_Socket).mIsConnected = (aOther->super_Socket).mIsConnected;
  (this->super_Socket).mSubType = MVar3;
  (this->super_Socket)._vptr_Socket = (_func_int **)&PTR__MockSocket_00277ca8;
  (this->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start =
       (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish =
       (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  (this->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage =
       (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (aOther->mLocalAddr).mBytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  this->mLocalPort = aOther->mLocalPort;
  (this->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
  _M_ptr = (aOther->mPeerSocket).
           super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  (this->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  p_Var1 = (aOther->mPeerSocket).
           super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
  (aOther->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (this->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var1;
  (aOther->mPeerSocket).super___shared_ptr<ot::commissioner::MockSocket,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->mRecvBuf).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  return;
}

Assistant:

MockSocket::MockSocket(MockSocket &&aOther)
    : Socket(std::move(aOther))
    , mLocalAddr(std::move(aOther.mLocalAddr))
    , mLocalPort(std::move(aOther.mLocalPort))
    , mPeerSocket(std::move(aOther.mPeerSocket))
{
}